

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool google::ParseTemplateArgs(State *state)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  undefined2 local_3a;
  undefined6 uStack_38;
  
  pcVar3 = state->mangled_cur;
  pcVar4 = state->out_cur;
  pcVar5 = state->out_begin;
  pcVar6 = state->out_end;
  uVar7 = *(undefined8 *)((long)&state->prev_name + 6);
  uStack_38 = (undefined6)((ulong)*(undefined8 *)((long)&state->out_end + 6) >> 0x10);
  local_3a = (undefined2)((ulong)pcVar6 >> 0x30);
  bVar1 = state->append;
  bVar2 = state->overflowed;
  state->append = false;
  if (*state->mangled_cur == 'I') {
    state->mangled_cur = state->mangled_cur + 1;
    bVar8 = ParseTemplateArg(state);
    if (bVar8) {
      do {
        bVar9 = ParseTemplateArg(state);
      } while (bVar9);
      if ((bVar8) && (*state->mangled_cur == 'E')) {
        state->mangled_cur = state->mangled_cur + 1;
        state->append = (bool)(bVar1 & 1);
        MaybeAppend(state,"<>");
        return true;
      }
    }
  }
  *(ulong *)((long)&state->out_end + 6) = CONCAT62(uStack_38,local_3a);
  *(undefined8 *)((long)&state->prev_name + 6) = uVar7;
  state->out_begin = pcVar5;
  state->out_end = pcVar6;
  state->mangled_cur = pcVar3;
  state->out_cur = pcVar4;
  state->append = bVar1;
  state->overflowed = bVar2;
  return false;
}

Assistant:

static bool ParseTemplateArgs(State *state) {
  State copy = *state;
  DisableAppend(state);
  if (ParseOneCharToken(state, 'I') &&
      OneOrMore(ParseTemplateArg, state) &&
      ParseOneCharToken(state, 'E')) {
    RestoreAppend(state, copy.append);
    MaybeAppend(state, "<>");
    return true;
  }
  *state = copy;
  return false;
}